

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::tuple<int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>,void>
     ::serialize_elems<OutputStream,0ul,1ul,2ul,3ul>(void)

{
  OutputStream *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  
  uVar1 = 1;
  std::
  get<0ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x165320);
  serialize<int,OutputStream>
            ((int *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
  std::
  get<1ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x16533f);
  serialize<std::vector<int,std::allocator<int>>,OutputStream>
            ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  std::
  get<2ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x16535e);
  serialize<std::pair<short,short>,OutputStream>
            ((pair<short,_short> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  std::
  get<3ul,int,std::vector<int,std::allocator<int>>,std::pair<short,short>,std::deque<char,std::allocator<char>>>
            ((tuple<int,_std::vector<int,_std::allocator<int>_>,_std::pair<short,_short>,_std::deque<char,_std::allocator<char>_>_>
              *)0x16537d);
  serialize<std::deque<char,std::allocator<char>>,OutputStream>
            ((deque<char,_std::allocator<char>_> *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void serialize_elems(const Tuple<E...>& t, OutputStream& ostream, std::index_sequence<I...>)
  {
    using swallow = int[];
    using std::get;
    (void)swallow{1, (mserialize::serialize(get<I>(t), ostream), int{})...};
  }